

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locality.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  ostream *poVar2;
  void *this;
  iterator iVar3;
  iterator iVar4;
  ulong uVar5;
  size_t sumResult;
  int sum;
  undefined1 local_e8 [8];
  vector<int,_hwlocxx::allocator<int>_> v1;
  size_t nElems;
  not_null<const_hwlocxx::topology_*> nStack_a0;
  topology local_90;
  undefined1 local_80 [8];
  allocator<int> a;
  object obj;
  undefined1 local_30 [8];
  topology topo;
  int topodepth;
  int n;
  int i;
  int depth;
  
  hwlocxx::topology::topology((topology *)local_30);
  topo.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = hwlocxx::topology::get_depth((topology *)local_30);
  for (n = 0; n < topo.topology_.super___shared_ptr<hwloc_topology,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_; n = n + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"*** Objects at level ");
    this = (void *)std::ostream::operator<<(poVar2,n);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    topodepth = 0;
    while( true ) {
      iVar1 = hwlocxx::topology::get_width_at_depth((topology *)local_30,n);
      if (iVar1 <= topodepth) break;
      poVar2 = std::operator<<((ostream *)&std::cout,"Index ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,topodepth);
      poVar2 = std::operator<<(poVar2,":");
      hwlocxx::topology::get_obj((topology *)&obj.topo_,(int)local_30,n);
      poVar2 = hwlocxx::operator<<(poVar2,(object *)&obj.topo_);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      topodepth = topodepth + 1;
    }
  }
  hwlocxx::topology::get_width_by_type((topology *)local_30,HWLOC_OBJ_NUMANODE);
  hwlocxx::topology::get_object_by_type((topology *)&a.obj_.topo_,(hwloc_obj_type_t)local_30,0xd);
  hwlocxx::topology::topology(&local_90,(topology *)local_30);
  nElems = (size_t)a.obj_.topo_.ptr_;
  nStack_a0.ptr_ = (topology *)obj.obj_.ptr_;
  hwlocxx::allocator<int>::allocator((allocator<int> *)local_80,&local_90,(object *)&nElems);
  hwlocxx::topology::~topology(&local_90);
  v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0xa;
  std::vector<int,_hwlocxx::allocator<int>_>::vector
            ((vector<int,_hwlocxx::allocator<int>_> *)local_e8,10,(allocator_type *)local_80);
  iVar3 = std::begin<std::vector<int,hwlocxx::allocator<int>>>
                    ((vector<int,_hwlocxx::allocator<int>_> *)local_e8);
  iVar4 = std::end<std::vector<int,hwlocxx::allocator<int>>>
                    ((vector<int,_hwlocxx::allocator<int>_> *)local_e8);
  std::iota<__gnu_cxx::__normal_iterator<int*,std::vector<int,hwlocxx::allocator<int>>>,int>
            ((__normal_iterator<int_*,_std::vector<int,_hwlocxx::allocator<int>_>_>)iVar3._M_current
             ,(__normal_iterator<int_*,_std::vector<int,_hwlocxx::allocator<int>_>_>)
              iVar4._M_current,1);
  iVar3 = std::begin<std::vector<int,hwlocxx::allocator<int>>>
                    ((vector<int,_hwlocxx::allocator<int>_> *)local_e8);
  iVar4 = std::end<std::vector<int,hwlocxx::allocator<int>>>
                    ((vector<int,_hwlocxx::allocator<int>_> *)local_e8);
  iVar1 = std::
          accumulate<__gnu_cxx::__normal_iterator<int*,std::vector<int,hwlocxx::allocator<int>>>,int,std::plus<void>>
                    (iVar3._M_current,iVar4._M_current,0);
  uVar5 = (long)v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage *
          ((long)v1.super__Vector_base<int,_hwlocxx::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage + 1);
  std::vector<int,_hwlocxx::allocator<int>_>::~vector
            ((vector<int,_hwlocxx::allocator<int>_> *)local_e8);
  hwlocxx::allocator<int>::~allocator((allocator<int> *)local_80);
  hwlocxx::topology::~topology((topology *)local_30);
  return (int)(uVar5 >> 1) - iVar1;
}

Assistant:

int main()
{
   int depth;
   int i, n;
   int topodepth;

   hwlocxx::topology topo;

   /* Optionally, get some additional topology information
      in case we need the topology depth later. */
   topodepth = topo.get_depth();

   /*
    * Example:
    *   Print the topology
    */
   for (depth = 0; depth < topodepth; depth++)
   {
      std::cout << "*** Objects at level " << depth << std::endl;
      for (i = 0; i < topo.get_width_at_depth(depth); i++)
      {
         std::cout << "Index " << i << ":" << topo.get_obj(depth, i)
                   << std::endl;
      }
   }

   /* Example:
    *    Use the hwlocxx allocator to allocate storage for a vector
    */
   n = topo.get_width_by_type(HWLOC_OBJ_NUMANODE);
   auto obj = topo.get_object_by_type(HWLOC_OBJ_NUMANODE, n - 1);
   hwlocxx::allocator<int> a{topo, obj};

   size_t nElems = 10u;
   std::vector<int, hwlocxx::allocator<int>> v1{nElems, a};
   std::iota(std::begin(v1), std::end(v1), 1);
   auto sum = std::accumulate(std::begin(v1), std::end(v1), 0, std::plus<>());
   auto sumResult = (nElems * (nElems + 1) / 2);
   return static_cast<int>(sumResult - sum);
}